

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_common_content_access<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>,std::pair<unsigned_int,unsigned_int>>
               (Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  node_ptr prVar4;
  pointer puVar5;
  Column_support *pCVar6;
  node_ptr prVar7;
  node_ptr prVar8;
  Column_support *pCVar9;
  Column_support *pCVar10;
  node_ptr end;
  Column_support *pCVar11;
  uint uVar12;
  ulong uVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container;
  _Rb_tree_node_base local_238;
  undefined **local_210;
  ulong local_208;
  shared_count sStack_200;
  _Base_ptr local_1f8;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_1f0;
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_1c0;
  _Rb_tree_node_base local_1b8;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  size_t local_140;
  size_t local_138;
  size_t *local_130;
  size_t *local_128;
  char *local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,false,true>>>>
            ((column_content<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>_>
              *)&local_1f0,col);
  local_1c0 = setcont;
  if (local_1f0._M_impl.super__Rb_tree_header._M_node_count ==
      (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar1 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>>
                      ((_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       local_1f0._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       &local_1f0._M_impl.super__Rb_tree_header,
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar1 = false;
  }
  local_238._M_color._0_1_ = bVar1;
  local_238._M_parent = (_Base_ptr)0x0;
  local_238._M_left = (_Base_ptr)0x0;
  local_1b8._0_8_ = "get_column_content_via_iterators(col) == setcont";
  local_1b8._M_parent = (_Base_ptr)0x1c3b0c;
  local_208 = local_208 & 0xffffffffffffff00;
  local_210 = &PTR__lazy_ostream_001fc398;
  sStack_200.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_1f8 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_238._M_left);
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_1f0);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x11e);
  uVar12 = (uint)((ulong)((long)(veccont->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(veccont->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar12 < 0) {
    local_1f0._M_impl._0_8_ = &col->column_;
    sVar3 = boost::intrusive::
            bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                      ((const_node_ptr *)&local_1f0);
    if (sVar3 == 0) {
      local_238._0_8_ = (_Base_ptr)0x0;
      local_238._M_parent = (_Base_ptr)0x0;
      local_238._M_left = (_Base_ptr)0x0;
      goto LAB_00117762;
    }
    local_1f0._M_impl._0_8_ = &col->column_;
    prVar4 = boost::intrusive::
             bstree_algorithms_base<boost::intrusive::rbtree_node_traits<void_*,_false>_>::prev_node
                       ((node_ptr *)&local_1f0);
    uVar12 = *(int *)&prVar4[1].parent_ + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_238,(long)(int)uVar12,
             (allocator_type *)&local_1f0);
  prVar7 = *(node_ptr *)
            ((long)&(col->column_).super_type.
                    super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
            + 8);
  while ((prVar7 != (node_ptr)&col->column_ && (*(uint *)&prVar7[1].parent_ < uVar12))) {
    ((_Rb_tree_color *)local_238._0_8_)[*(uint *)&prVar7[1].parent_] =
         *(_Rb_tree_color *)((long)&prVar7[-1].left_ + 4);
    prVar8 = prVar7->right_;
    if (prVar7->right_ == (node_ptr)0x0) {
      do {
        prVar8 = prVar7;
        prVar7 = prVar8->parent_;
      } while (prVar8 == prVar7->right_);
      if (prVar8->right_ == prVar7) {
        prVar7 = prVar8;
      }
    }
    else {
      do {
        prVar7 = prVar8;
        prVar8 = prVar7->left_;
      } while (prVar7->left_ != (node_ptr)0x0);
    }
  }
LAB_00117762:
  puVar5 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_238._M_parent - local_238._0_8_ ==
      (long)(veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar5) {
    if (local_238._M_parent == (_Base_ptr)local_238._0_8_) {
      bVar1 = true;
    }
    else {
      iVar2 = bcmp((void *)local_238._0_8_,puVar5,(long)local_238._M_parent - local_238._0_8_);
      bVar1 = iVar2 == 0;
    }
  }
  else {
    bVar1 = false;
  }
  local_210 = (undefined **)CONCAT71(local_210._1_7_,bVar1);
  local_208 = 0;
  sStack_200.pi_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ = "col.get_content(veccont.size()) == veccont";
  local_1b8._M_parent = (_Base_ptr)0x1c3b37;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_1f0._M_impl._0_8_ = &PTR__lazy_ostream_001fc398;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_left = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_200);
  if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_238._0_8_,(long)local_238._M_left - local_238._0_8_);
  }
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x120);
  local_238._M_parent = (_Base_ptr)((ulong)local_238._M_parent & 0xffffffffffffff00);
  local_238._0_8_ = &PTR__lazy_ostream_001fc428;
  local_238._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_238._M_right = (_Base_ptr)0x1c3304;
  pCVar11 = &col->column_;
  local_1f0._M_impl._0_8_ = pCVar11;
  local_138 = boost::intrusive::
              bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::size
                        ((const_node_ptr *)&local_1f0);
  local_128 = &local_138;
  local_140 = (local_1c0->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_130 = &local_140;
  local_1b8._M_color._0_1_ = local_138 == local_140;
  local_1b8._M_parent = (_Base_ptr)0x0;
  local_1b8._M_left = (_Base_ptr)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_128;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_1f0._M_impl._0_8_ = &PTR__lazy_ostream_001fc3e8;
  local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1f8 = (_Base_ptr)&local_130;
  local_208 = local_208 & 0xffffffffffffff00;
  local_210 = &PTR__lazy_ostream_001fc3e8;
  sStack_200.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,&local_238,&local_40,0x120,1,2,2,"col.size()",&local_1f0,"setcont.size()",
             &local_210);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1b8._M_left);
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x124);
    local_210 = (undefined **)
                CONCAT71(local_210._1_7_,
                         *(long *)&(pCVar11->super_type).
                                   super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                                   .holder == 0);
    local_208 = 0;
    sStack_200.pi_ = (sp_counted_base *)0x0;
    local_238._0_8_ = "col.is_empty()";
    local_238._M_parent = (_Base_ptr)0x1c3b61;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_1f0._M_impl._0_8_ = &PTR__lazy_ostream_001fc398;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_left = &local_238;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_f8 = "";
    local_110 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x126);
    local_210 = (undefined **)
                CONCAT71(local_210._1_7_,
                         *(long *)&(pCVar11->super_type).
                                   super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                                   .
                                   super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                                   .holder != 0);
    local_208 = 0;
    sStack_200.pi_ = (sp_counted_base *)0x0;
    local_238._0_8_ = "!col.is_empty()";
    local_238._M_parent = (_Base_ptr)0x1c3b61;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_1f0._M_impl._0_8_ = &PTR__lazy_ostream_001fc398;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_1f0._M_impl.super__Rb_tree_header._M_header._M_left = &local_238;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_118 = (_Base_ptr)0x1c3adb;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_200);
  puVar5 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    uVar13 = 0;
    do {
      uVar12 = (uint)uVar13;
      if (puVar5[uVar13] == 0) {
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_148 = "";
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        local_158 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x12a,
                   &local_160);
        pCVar9 = *(Column_support **)
                  &(pCVar11->super_type).
                   super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                   .holder;
        pCVar6 = pCVar11;
        pCVar10 = pCVar11;
        if (pCVar9 != (Column_support *)0x0) {
          do {
            if (*(uint *)(pCVar9 + 1) >= uVar12) {
              pCVar6 = pCVar9;
            }
            pCVar9 = *(Column_support **)
                      ((long)&(pCVar9->super_type).
                              super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                              .
                              super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                              .
                              super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                              .
                              super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                              .
                              super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                      + (ulong)(*(uint *)(pCVar9 + 1) < uVar12) * 8 + 8);
          } while (pCVar9 != (Column_support *)0x0);
          if ((pCVar6 != pCVar11) && (pCVar10 = pCVar6, uVar12 < *(uint *)(pCVar6 + 1))) {
            pCVar10 = pCVar11;
          }
        }
        local_210 = (undefined **)CONCAT71(local_210._1_7_,pCVar10 == pCVar11);
        local_208 = 0;
        sStack_200.pi_ = (sp_counted_base *)0x0;
        local_238._0_8_ = "!col.is_non_zero(i)";
        local_238._M_parent = (_Base_ptr)0x1c3b75;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
        local_1f0._M_impl._0_8_ = &PTR__lazy_ostream_001fc398;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_left = &local_238;
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        boost::test_tools::tt_detail::report_assertion(&local_210,&local_1f0,&local_170,0x12a,1,0,0)
        ;
      }
      else {
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,300,&local_190)
        ;
        pCVar9 = *(Column_support **)
                  &(pCVar11->super_type).
                   super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                   .holder;
        pCVar6 = pCVar11;
        pCVar10 = pCVar11;
        if (pCVar9 != (Column_support *)0x0) {
          do {
            if (*(uint *)(pCVar9 + 1) >= uVar12) {
              pCVar6 = pCVar9;
            }
            pCVar9 = *(Column_support **)
                      ((long)&(pCVar9->super_type).
                              super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                              .
                              super_bstbase<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                              .
                              super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                              .
                              super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                              .
                              super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_false,_true>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                      + (ulong)(*(uint *)(pCVar9 + 1) < uVar12) * 8 + 8);
          } while (pCVar9 != (Column_support *)0x0);
          if ((pCVar6 != pCVar11) && (pCVar10 = pCVar6, uVar12 < *(uint *)(pCVar6 + 1))) {
            pCVar10 = pCVar11;
          }
        }
        local_210 = (undefined **)CONCAT71(local_210._1_7_,pCVar10 != pCVar11);
        local_208 = 0;
        sStack_200.pi_ = (sp_counted_base *)0x0;
        local_238._0_8_ = "col.is_non_zero(i)";
        local_238._M_parent = (_Base_ptr)0x1c3b75;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
        local_1f0._M_impl._0_8_ = &PTR__lazy_ostream_001fc398;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_left = &local_238;
        local_1b8._M_right = (_Base_ptr)0x1c3a68;
        local_198 = "";
        boost::test_tools::tt_detail::report_assertion
                  (&local_210,&local_1f0,&local_1b8._M_right,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_200);
      uVar13 = (ulong)(uVar12 + 1);
      puVar5 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(veccont->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2))
    ;
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}